

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMultiProcessHandler.cxx
# Opt level: O2

void __thiscall cmCTestMultiProcessHandler::PrintOutputAsJson(cmCTestMultiProcessHandler *this)

{
  cmCTestTestHandler *pcVar1;
  cmCTestTestProperties *testProperties;
  pointer pbVar2;
  PropertiesMap *pPVar3;
  bool bVar4;
  int iVar5;
  Value *pVVar6;
  _Base_ptr p_Var7;
  StreamWriter *pSVar8;
  allocator<char> local_479;
  cmCTestMultiProcessHandler *local_478;
  Value result;
  Value testInfo;
  cmWorkingDirectory workdir;
  Value tests;
  BacktraceData backtraceGraph;
  StreamWriterBuilder builder;
  
  pcVar1 = this->TestHandler;
  local_478 = this;
  iVar5 = FindMaxIndex(this);
  pcVar1->MaxIndex = iVar5;
  Json::Value::Value(&result,objectValue);
  Json::Value::Value((Value *)&builder,"ctestInfo");
  pVVar6 = Json::Value::operator[](&result,"kind");
  Json::Value::operator=(pVVar6,(Value *)&builder);
  Json::Value::~Value((Value *)&builder);
  Json::Value::Value((Value *)&backtraceGraph,objectValue);
  Json::Value::Value((Value *)&builder,1);
  pVVar6 = Json::Value::operator[]((Value *)&backtraceGraph,"major");
  Json::Value::operator=(pVVar6,(Value *)&builder);
  Json::Value::~Value((Value *)&builder);
  Json::Value::Value((Value *)&builder,0);
  pVVar6 = Json::Value::operator[]((Value *)&backtraceGraph,"minor");
  Json::Value::operator=(pVVar6,(Value *)&builder);
  Json::Value::~Value((Value *)&builder);
  pVVar6 = Json::Value::operator[](&result,"version");
  Json::Value::operator=(pVVar6,(Value *)&backtraceGraph);
  Json::Value::~Value((Value *)&backtraceGraph);
  BacktraceData::BacktraceData(&backtraceGraph);
  Json::Value::Value(&tests,arrayValue);
  p_Var7 = (local_478->Properties).
           super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
           ._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  pPVar3 = &local_478->Properties;
  do {
    if ((_Rb_tree_header *)p_Var7 ==
        &(pPVar3->
         super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
         )._M_t._M_impl.super__Rb_tree_header) {
      BacktraceData::Dump((Value *)&builder,&backtraceGraph);
      pVVar6 = Json::Value::operator[](&result,"backtraceGraph");
      Json::Value::operator=(pVVar6,(Value *)&builder);
      Json::Value::~Value((Value *)&builder);
      pVVar6 = Json::Value::operator[](&result,"tests");
      Json::Value::operator=(pVVar6,&tests);
      Json::StreamWriterBuilder::StreamWriterBuilder(&builder);
      Json::Value::Value((Value *)&workdir,"  ");
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&testInfo,"indentation",&local_479);
      pVVar6 = Json::StreamWriterBuilder::operator[](&builder,(String *)&testInfo);
      Json::Value::operator=(pVVar6,(Value *)&workdir);
      std::__cxx11::string::~string((string *)&testInfo);
      Json::Value::~Value((Value *)&workdir);
      pSVar8 = Json::StreamWriterBuilder::newStreamWriter(&builder);
      (*pSVar8->_vptr_StreamWriter[2])(pSVar8,&result,&std::cout);
      (*pSVar8->_vptr_StreamWriter[1])(pSVar8);
      Json::StreamWriterBuilder::~StreamWriterBuilder(&builder);
      Json::Value::~Value(&tests);
      BacktraceData::~BacktraceData(&backtraceGraph);
      Json::Value::~Value(&result);
      return;
    }
    testProperties = (cmCTestTestProperties *)p_Var7[1]._M_parent;
    cmWorkingDirectory::cmWorkingDirectory(&workdir,&testProperties->Directory);
    cmCTestRunTest::cmCTestRunTest((cmCTestRunTest *)&builder,local_478,testProperties->Index);
    cmCTestRunTest::ComputeArguments((cmCTestRunTest *)&builder);
    pbVar2 = (testProperties->Args).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(testProperties->Args).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2) < 0x21) {
LAB_001e226f:
      DumpCTestInfo(&testInfo,(cmCTestRunTest *)&builder,testProperties,&backtraceGraph);
      Json::Value::append(&tests,&testInfo);
      Json::Value::~Value(&testInfo);
    }
    else {
      bVar4 = std::operator==(pbVar2 + 1,"NOT_AVAILABLE");
      if (!bVar4) goto LAB_001e226f;
    }
    cmCTestRunTest::~cmCTestRunTest((cmCTestRunTest *)&builder);
    cmWorkingDirectory::~cmWorkingDirectory(&workdir);
    p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7);
  } while( true );
}

Assistant:

void cmCTestMultiProcessHandler::PrintOutputAsJson()
{
  this->TestHandler->SetMaxIndex(this->FindMaxIndex());

  Json::Value result = Json::objectValue;
  result["kind"] = "ctestInfo";
  result["version"] = DumpVersion(1, 0);

  BacktraceData backtraceGraph;
  Json::Value tests = Json::arrayValue;
  for (auto& it : this->Properties) {
    cmCTestTestHandler::cmCTestTestProperties& p = *it.second;

    // Don't worry if this fails, we are only showing the test list, not
    // running the tests
    cmWorkingDirectory workdir(p.Directory);
    cmCTestRunTest testRun(*this, p.Index);
    testRun.ComputeArguments();

    // Skip tests not available in this configuration.
    if (p.Args.size() >= 2 && p.Args[1] == "NOT_AVAILABLE") {
      continue;
    }

    Json::Value testInfo = DumpCTestInfo(testRun, p, backtraceGraph);
    tests.append(testInfo);
  }
  result["backtraceGraph"] = backtraceGraph.Dump();
  result["tests"] = std::move(tests);

  Json::StreamWriterBuilder builder;
  builder["indentation"] = "  ";
  std::unique_ptr<Json::StreamWriter> jout(builder.newStreamWriter());
  jout->write(result, &std::cout);
}